

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O1

void __thiscall GLPortal::SaveMapSection(GLPortal *this)

{
  TArray<unsigned_char,_unsigned_char>::Resize(&this->savedmapsection,currentmapsection.Count);
  memcpy((this->savedmapsection).Array,currentmapsection.Array,(ulong)currentmapsection.Count);
  memset(currentmapsection.Array,0,(ulong)currentmapsection.Count);
  return;
}

Assistant:

void GLPortal::SaveMapSection()
{
	savedmapsection.Resize(currentmapsection.Size());
	memcpy(&savedmapsection[0], &currentmapsection[0], currentmapsection.Size());
	memset(&currentmapsection[0], 0, currentmapsection.Size());
}